

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int32_t helicsDataBufferFillFromString(HelicsDataBuffer data,char *str)

{
  SmallBuffer *store;
  int32_t iVar1;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  store = getBuffer(data);
  iVar1 = 0;
  if (store != (SmallBuffer *)0x0) {
    local_28._M_len = strlen(str);
    local_28._M_str = str;
    helics::ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (&local_28,store);
    iVar1 = (int32_t)store->bufferSize;
  }
  return iVar1;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromString(HelicsDataBuffer data, const char* str)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<std::string_view>::convert(std::string_view(str), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}